

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O2

void lanli_unescape_html(lanli_buffer *ob,uint8_t *data,size_t size)

{
  byte bVar1;
  html_entity *phVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint8_t *str;
  ulong uVar9;
  uint c;
  
  uVar9 = 0;
  do {
    uVar6 = uVar9;
    sVar4 = size;
    if (size < uVar9) {
      sVar4 = uVar9;
    }
    for (; sVar4 != uVar6; uVar6 = uVar6 + 1) {
      sVar5 = uVar6;
      if (data[uVar6] == '&') goto LAB_0011ddff;
    }
    sVar5 = sVar4;
    if (uVar9 == 0) {
      lanli_buffer_put(ob,data,size);
      return;
    }
LAB_0011ddff:
    if (uVar9 <= sVar5 && sVar5 - uVar9 != 0) {
      lanli_buffer_put(ob,data + uVar9,sVar5 - uVar9);
    }
    if (size <= uVar6) {
      return;
    }
    str = data + sVar5 + 1;
    uVar9 = size - (sVar5 + 1);
    if ((uVar9 < 4) || (*str != '#')) {
      if (0x1e < uVar9) {
        uVar9 = 0x1f;
      }
      uVar6 = 2;
      while( true ) {
        if ((uVar9 <= uVar6) || (data[uVar6 + sVar5 + 1] == ' ')) goto LAB_0011df7c;
        if (data[uVar6 + sVar5 + 1] == ';') break;
        uVar6 = uVar6 + 1;
      }
      phVar2 = find_entity((char *)str,(uint)uVar6);
      if (phVar2 != (html_entity *)0x0) {
        lanli_buffer_put(ob,phVar2->utf8,phVar2->size);
        goto LAB_0011def0;
      }
LAB_0011df7c:
      lanli_buffer_putc(ob,'&');
LAB_0011df89:
      lVar7 = 0;
    }
    else {
      if ((byte)(data[sVar5 + 2] - 0x30) < 10) {
        c = 0;
        for (uVar6 = 1; sVar5 + (2 - size) + uVar6 != 1; uVar6 = uVar6 + 1) {
          if (9 < (byte)(data[uVar6 + sVar5 + 1] - 0x30)) goto LAB_0011df5a;
          c = (c * 10 + (uint)data[uVar6 + sVar5 + 1]) - 0x30;
        }
        goto LAB_0011df7c;
      }
      if ((data[sVar5 + 2] | 0x20) == 0x78) {
        c = 0;
        for (uVar8 = 2; uVar6 = uVar9, uVar8 < uVar9; uVar8 = uVar8 + 1) {
          bVar1 = data[uVar8 + sVar5 + 1];
          pvVar3 = memchr("0123456789ABCDEFabcdef",(uint)bVar1,0x17);
          uVar6 = uVar8;
          if (pvVar3 == (void *)0x0) break;
          c = (c * 0x10 + (uint)(byte)((bVar1 | 0x20) % 0x27)) - 9;
        }
        if (uVar6 != 2) goto LAB_0011df5a;
        goto LAB_0011df89;
      }
      uVar6 = 0;
      c = 0;
LAB_0011df5a:
      if ((uVar9 <= uVar6) || (str[uVar6] != ';')) goto LAB_0011df7c;
      lanli_buffer_put_utf8(ob,c);
LAB_0011def0:
      lVar7 = uVar6 + 1;
    }
    uVar9 = lVar7 + sVar5 + 1;
  } while( true );
}

Assistant:

void lanli_unescape_html(lanli_buffer *ob, const uint8_t *data, size_t size) {
  size_t i = 0, mark;

  while (1) {
    mark = i;
    while (i < size && data[i] != '&') i++;

    /* Optimization for cases where there's nothing to escape */
    if (mark == 0 && i >= size) {
      lanli_buffer_put(ob, data, size);
      return;
    }

    if (likely(i > mark))
      lanli_buffer_put(ob, data + mark, i - mark);

    if (i >= size) break;

    i++;
    i += unescape_entity(ob, data + i, size - i);
  }
}